

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  RegularExpressionMatch *this_00;
  bool bVar1;
  bool local_13f;
  bool local_13c;
  bool local_13a;
  anon_class_8_1_c61d8849 local_128;
  anon_class_8_1_c61d8849 fileSearch;
  undefined1 local_110 [8];
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  string *name_local;
  cmRuntimeDependencyArchive *this_local;
  
  this_00 = (RegularExpressionMatch *)(&regexMatch.name.field_2._M_allocated_capacity + 1);
  cmsys::RegularExpressionMatch::RegularExpressionMatch(this_00);
  regexSearch.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)this_00;
  std::__cxx11::string::string((string *)&regexMatch,(string *)name);
  fileMatch.name.field_2._8_8_ = &regexSearch;
  std::__cxx11::string::string((string *)local_110,(string *)name);
  local_128.fileMatch = (anon_class_32_1_898f2789_for__M_pred *)local_110;
  bVar1 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                    (&local_128,&this->PostExcludeFilesStrict);
  local_13a = true;
  if (!bVar1) {
    bVar1 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      ((anon_class_8_1_60cb577c *)((long)&fileMatch.name.field_2 + 8),
                       &this->PostIncludeRegexes);
    local_13c = false;
    if (!bVar1) {
      bVar1 = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                        (&local_128,&this->PostIncludeFiles);
      local_13c = false;
      if (!bVar1) {
        bVar1 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          ((anon_class_8_1_60cb577c *)((long)&fileMatch.name.field_2 + 8),
                           &this->PostExcludeRegexes);
        local_13f = true;
        if (!bVar1) {
          local_13f = IsPostExcluded::anon_class_8_1_c61d8849::operator()
                                (&local_128,&this->PostExcludeFiles);
        }
        local_13c = local_13f;
      }
    }
    local_13a = local_13c;
  }
  IsPostExcluded(std::__cxx11::string_const&)::~__2
            ((IsPostExcluded_std____cxx11__string_const__ *)local_110);
  IsPostExcluded(std::__cxx11::string_const&)::~__3
            ((IsPostExcluded_std____cxx11__string_const__ *)&regexSearch);
  return local_13a;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}